

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

UOConfig * __thiscall QPDFJob::UOConfig::from(UOConfig *this,string *parameter)

{
  QPDFJob *this_00;
  string *psVar1;
  ulong uVar2;
  char *range;
  element_type *peVar3;
  vector<int,_std::allocator<int>_> local_30;
  string *local_18;
  string *parameter_local;
  UOConfig *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = this->config->o;
    range = (char *)std::__cxx11::string::c_str();
    parseNumrange(&local_30,this_00,range,0);
    std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  }
  psVar1 = local_18;
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->config->o);
  std::__cxx11::string::operator=((string *)&peVar3->under_overlay->from_nr,(string *)psVar1);
  return this;
}

Assistant:

QPDFJob::UOConfig*
QPDFJob::UOConfig::from(std::string const& parameter)
{
    if (!parameter.empty()) {
        config->o.parseNumrange(parameter.c_str(), 0);
    }
    config->o.m->under_overlay->from_nr = parameter;
    return this;
}